

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O2

void __thiscall
gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::Image
          (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *this,long w,long h,int d)

{
  this->depth = 0;
  this->width = 0;
  this->height = 0;
  this->n = 0;
  this->pixel = (uchar *)0x0;
  this->row = (uchar **)0x0;
  this->img = (uchar ***)0x0;
  setSize(this,w,h,(long)d);
  return;
}

Assistant:

Image(long w=0, long h=0, int d=1)
    {
      depth=0;
      width=0;
      height=0;
      n=0;
      pixel=0;
      row=0;
      img=0;

      setSize(w, h, d);
    }